

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int param_1,char **argv)

{
  bool bVar1;
  parse_opts_t pVar2;
  int iVar3;
  opt_t *poVar4;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  uint uVar5;
  char **ppcVar6;
  char *pcVar7;
  Input input;
  Scanner scanner;
  Output output;
  Input local_2b0;
  Scanner local_288;
  Output local_218;
  
  pVar2 = re2c::parse_opts(argv,(Opt *)&re2c::opts);
  if (pVar2 == EXIT_OK) {
    return 0;
  }
  if (pVar2 == EXIT_FAIL) {
    return 1;
  }
  pcVar7 = re2c::opts;
  re2c::Input::Input(&local_2b0,re2c::opts);
  iVar3 = re2c::Input::open(&local_2b0,pcVar7,__oflag);
  pcVar7 = DAT_0015d320;
  if ((char)iVar3 == '\0') {
    uVar5 = 1;
    re2c::error("cannot open source file: %s",re2c::opts);
    goto LAB_0013b86b;
  }
  poVar4 = re2c::realopt_t::operator->((realopt_t *)&DAT_0015d868);
  re2c::Output::Output(&local_218,pcVar7,poVar4->header_file);
  iVar3 = re2c::OutputFile::open(&local_218.source,pcVar7,__oflag_00);
  if ((char)iVar3 == '\0') {
    ppcVar6 = &DAT_0015d320;
    pcVar7 = "cannot open output file: %s";
LAB_0013b84f:
    uVar5 = 1;
    re2c::error(pcVar7,*ppcVar6);
  }
  else {
    poVar4 = re2c::realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar4->tFlag == true) &&
       (iVar3 = re2c::HeaderFile::open(&local_218.header,pcVar7,__oflag_01), (char)iVar3 == '\0')) {
      poVar4 = re2c::realopt_t::operator->((realopt_t *)&DAT_0015d868);
      ppcVar6 = &poVar4->header_file;
      pcVar7 = "cannot open header file: %s";
      goto LAB_0013b84f;
    }
    re2c::Scanner::Scanner(&local_288,&local_2b0,&local_218.source);
    re2c::parse(&local_288,&local_218);
    bVar1 = re2c::Warn::error((Warn *)re2c::warn);
    uVar5 = (uint)bVar1;
    re2c::Scanner::~Scanner(&local_288);
  }
  re2c::Output::~Output(&local_218);
LAB_0013b86b:
  re2c::Input::~Input(&local_2b0);
  return uVar5;
}

Assistant:

int main(int, char *argv[])
{
	switch (parse_opts (argv, opts))
	{
		case OK:        break;
		case EXIT_OK:   return 0;
		case EXIT_FAIL: return 1;
	}

	// set up the source stream
	re2c::Input input (opts.source_file);
	if (!input.open ())
	{
		error ("cannot open source file: %s", opts.source_file);
		return 1;
	}

	// set up the output streams
	re2c::Output output (opts.output_file, opts->header_file);
	if (!output.source.open ())
	{
		error ("cannot open output file: %s", opts.output_file);
		return 1;
	}
	if (opts->tFlag && !output.header.open ())
	{
		error ("cannot open header file: %s", opts->header_file);
		return 1;
	}

	Scanner scanner (input, output.source);
	parse (scanner, output);

	return warn.error () ? 1 : 0;
}